

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::ClearField
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field)

{
  uint uVar1;
  undefined8 *puVar2;
  string *psVar3;
  uint uVar4;
  int iVar5;
  undefined4 uVar6;
  LogMessage *other;
  long lVar7;
  uint uVar8;
  long lVar9;
  LogFinisher local_59;
  LogMessage local_58;
  
  if (*(Descriptor **)(field + 0x38) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"ClearField","Field does not match message type.");
  }
  if (field[0x34] == (FieldDescriptor)0x1) {
    iVar5 = this->extensions_offset_;
    if (iVar5 == -1) {
      LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/generated_message_reflection.cc"
                 ,0x4b5);
      other = LogMessage::operator<<(&local_58,"CHECK failed: (extensions_offset_) != (-1): ");
      LogFinisher::operator=(&local_59,other);
      LogMessage::~LogMessage(&local_58);
      iVar5 = this->extensions_offset_;
    }
    ExtensionSet::ClearExtension
              ((ExtensionSet *)((long)&(message->super_MessageLite)._vptr_MessageLite + (long)iVar5)
               ,*(int *)(field + 0x28));
    return;
  }
  if (*(int *)(field + 0x30) == 3) {
    switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x2c) * 4))
    {
    case 1:
    case 2:
    case 3:
    case 4:
    case 5:
    case 6:
    case 7:
    case 8:
      lVar7 = (long)this->offsets_
                    [(int)((ulong)((long)field - *(long *)(*(long *)(field + 0x38) + 0x30)) >> 3) *
                     -0x11111111];
      break;
    case 9:
      lVar7 = (long)this->offsets_
                    [(int)((ulong)((long)field - *(long *)(*(long *)(field + 0x38) + 0x30)) >> 3) *
                     -0x11111111];
      if (0 < *(int *)((long)&message[1].super_MessageLite._vptr_MessageLite + lVar7)) {
        lVar9 = 0;
        do {
          puVar2 = *(undefined8 **)
                    (*(long *)((long)&(message->super_MessageLite)._vptr_MessageLite + lVar7) +
                    lVar9 * 8);
          puVar2[1] = 0;
          *(undefined1 *)*puVar2 = 0;
          lVar9 = lVar9 + 1;
        } while (lVar9 < *(int *)((long)&message[1].super_MessageLite._vptr_MessageLite + lVar7));
      }
      break;
    case 10:
      lVar7 = (long)this->offsets_
                    [(int)((ulong)((long)field - *(long *)(*(long *)(field + 0x38) + 0x30)) >> 3) *
                     -0x11111111];
      if (0 < *(int *)((long)&message[1].super_MessageLite._vptr_MessageLite + lVar7)) {
        lVar9 = 0;
        do {
          (**(code **)(**(long **)(*(long *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                                            lVar7) + lVar9 * 8) + 0x20))();
          lVar9 = lVar9 + 1;
        } while (lVar9 < *(int *)((long)&message[1].super_MessageLite._vptr_MessageLite + lVar7));
      }
      *(undefined4 *)((long)&message[1].super_MessageLite._vptr_MessageLite + lVar7) = 0;
      return;
    default:
      return;
    }
    *(undefined4 *)((long)&message[1].super_MessageLite._vptr_MessageLite + lVar7) = 0;
    return;
  }
  lVar7 = ((long)field - *(long *)(*(long *)(field + 0x38) + 0x30) >> 3) * -0x1111111111111111;
  uVar4 = (uint)lVar7;
  uVar8 = uVar4 + 0x1f;
  if (-1 < (int)uVar4) {
    uVar8 = uVar4;
  }
  uVar1 = *(uint *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                   (long)((int)uVar8 >> 5) * 4 + (long)this->has_bits_offset_);
  if ((uVar1 >> (uVar4 & 0x1f) & 1) == 0) {
    return;
  }
  *(uint *)((long)&(message->super_MessageLite)._vptr_MessageLite +
           (long)((int)uVar8 >> 5) * 4 + (long)this->has_bits_offset_) =
       uVar1 & ~(1 << ((byte)lVar7 & 0x1f));
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x2c) * 4)) {
  case 1:
  case 3:
    uVar6 = *(undefined4 *)(field + 0x70);
    goto LAB_00209390;
  case 2:
  case 4:
    *(undefined8 *)
     ((long)&(message->super_MessageLite)._vptr_MessageLite + (long)this->offsets_[(int)uVar4]) =
         *(undefined8 *)(field + 0x70);
    break;
  case 5:
    *(undefined8 *)
     ((long)&(message->super_MessageLite)._vptr_MessageLite + (long)this->offsets_[(int)uVar4]) =
         *(undefined8 *)(field + 0x70);
    break;
  case 6:
    *(undefined4 *)
     ((long)&(message->super_MessageLite)._vptr_MessageLite + (long)this->offsets_[(int)uVar4]) =
         *(undefined4 *)(field + 0x70);
    break;
  case 7:
    *(FieldDescriptor *)
     ((long)&(message->super_MessageLite)._vptr_MessageLite + (long)this->offsets_[(int)uVar4]) =
         field[0x70];
    break;
  case 8:
    uVar6 = *(undefined4 *)(*(long *)(field + 0x70) + 0x10);
LAB_00209390:
    *(undefined4 *)
     ((long)&(message->super_MessageLite)._vptr_MessageLite + (long)this->offsets_[(int)uVar4]) =
         uVar6;
    break;
  case 9:
    psVar3 = *(string **)
              ((long)&(message->super_MessageLite)._vptr_MessageLite +
              (long)this->offsets_[(int)uVar4]);
    if (psVar3 != *(string **)
                   ((long)&(this->default_instance_->super_MessageLite)._vptr_MessageLite +
                   (long)this->offsets_[(int)uVar4])) {
      if (field[0x68] == (FieldDescriptor)0x1) {
        std::__cxx11::string::_M_assign(psVar3);
        return;
      }
      *(undefined8 *)(psVar3 + 8) = 0;
      **(undefined1 **)psVar3 = 0;
    }
    break;
  case 10:
    (**(code **)(**(long **)((long)&(message->super_MessageLite)._vptr_MessageLite +
                            (long)this->offsets_[(int)uVar4]) + 0x20))();
    return;
  }
  return;
}

Assistant:

void GeneratedMessageReflection::ClearField(
    Message* message, const FieldDescriptor* field) const {
  USAGE_CHECK_MESSAGE_TYPE(ClearField);

  if (field->is_extension()) {
    MutableExtensionSet(message)->ClearExtension(field->number());
  } else if (!field->is_repeated()) {
    if (HasBit(*message, field)) {
      ClearBit(message, field);

      // We need to set the field back to its default value.
      switch (field->cpp_type()) {
#define CLEAR_TYPE(CPPTYPE, TYPE)                                            \
        case FieldDescriptor::CPPTYPE_##CPPTYPE:                             \
          *MutableRaw<TYPE>(message, field) =                                \
            field->default_value_##TYPE();                                   \
          break;

        CLEAR_TYPE(INT32 , int32 );
        CLEAR_TYPE(INT64 , int64 );
        CLEAR_TYPE(UINT32, uint32);
        CLEAR_TYPE(UINT64, uint64);
        CLEAR_TYPE(FLOAT , float );
        CLEAR_TYPE(DOUBLE, double);
        CLEAR_TYPE(BOOL  , bool  );
#undef CLEAR_TYPE

        case FieldDescriptor::CPPTYPE_ENUM:
          *MutableRaw<int>(message, field) =
            field->default_value_enum()->number();
          break;

        case FieldDescriptor::CPPTYPE_STRING: {
          switch (field->options().ctype()) {
            default:  // TODO(kenton):  Support other string reps.
            case FieldOptions::STRING:
              const string* default_ptr = DefaultRaw<const string*>(field);
              string** value = MutableRaw<string*>(message, field);
              if (*value != default_ptr) {
                if (field->has_default_value()) {
                  (*value)->assign(field->default_value_string());
                } else {
                  (*value)->clear();
                }
              }
              break;
          }
          break;
        }

        case FieldDescriptor::CPPTYPE_MESSAGE:
          (*MutableRaw<Message*>(message, field))->Clear();
          break;
      }
    }
  } else {
    switch (field->cpp_type()) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                                     \
      case FieldDescriptor::CPPTYPE_##UPPERCASE :                             \
        MutableRaw<RepeatedField<LOWERCASE> >(message, field)->Clear();       \
        break

      HANDLE_TYPE( INT32,  int32);
      HANDLE_TYPE( INT64,  int64);
      HANDLE_TYPE(UINT32, uint32);
      HANDLE_TYPE(UINT64, uint64);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE( FLOAT,  float);
      HANDLE_TYPE(  BOOL,   bool);
      HANDLE_TYPE(  ENUM,    int);
#undef HANDLE_TYPE

      case FieldDescriptor::CPPTYPE_STRING: {
        switch (field->options().ctype()) {
          default:  // TODO(kenton):  Support other string reps.
          case FieldOptions::STRING:
            MutableRaw<RepeatedPtrField<string> >(message, field)->Clear();
            break;
        }
        break;
      }

      case FieldDescriptor::CPPTYPE_MESSAGE: {
        // We don't know which subclass of RepeatedPtrFieldBase the type is,
        // so we use RepeatedPtrFieldBase directly.
        MutableRaw<RepeatedPtrFieldBase>(message, field)
            ->Clear<GenericTypeHandler<Message> >();
        break;
      }
    }
  }
}